

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
::Container::Container
          (Container *this,int d,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_208;
  
  paVar2 = &local_208.super_BasicConstraint.name_.field_2;
  local_208.super_BasicConstraint.name_._M_dataplus._M_p =
       (c->super_BasicConstraint).name_._M_dataplus._M_p;
  paVar1 = &(c->super_BasicConstraint).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_BasicConstraint.name_._M_dataplus._M_p == paVar1) {
    local_208.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_208.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)((long)&(c->super_BasicConstraint).name_.field_2 + 8);
    local_208.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_208.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_208.super_BasicConstraint.name_._M_string_length =
       (c->super_BasicConstraint).name_._M_string_length;
  (c->super_BasicConstraint).name_._M_dataplus._M_p = (pointer)paVar1;
  (c->super_BasicConstraint).name_._M_string_length = 0;
  (c->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
       (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
       super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
  if (local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->super_QuadAndLinTerms).super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    (c->super_QuadAndLinTerms).super_LinTerms.coefs_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  }
  local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (c->super_QuadAndLinTerms).super_LinTerms.vars_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (c->super_QuadAndLinTerms).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (c->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_LinTerms.vars_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (c->super_QuadAndLinTerms).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
    .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (c->super_QuadAndLinTerms).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
    .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->super_QuadAndLinTerms).super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (c->super_QuadAndLinTerms).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
    .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
  move_initialize<8U,_nullptr>
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &local_208.super_QuadAndLinTerms.super_QuadTerms,
             (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &(c->super_QuadAndLinTerms).super_QuadTerms);
  local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
  super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
       (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
       super_small_vector_base<std::allocator<double>,_6U>.m_data.
       super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
  if (local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
         super_small_vector_base<std::allocator<double>,_6U>.m_data.
         super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    (c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
    super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  }
  local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
  super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
       super_small_vector_base<std::allocator<int>,_6U>.m_data.
       super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
         super_small_vector_base<std::allocator<int>,_6U>.m_data.
         super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
    super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  local_208.super_AlgConRhs<0>.rhs_ = (c->super_AlgConRhs<0>).rhs_;
  ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::ExprWrapper
            (&this->con_,&local_208);
  if (6 < local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_208.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_208.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
    operator_delete(local_208.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_208.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }